

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

bool __thiscall GraphNode::hasPointer(GraphNode *this,int value)

{
  bool bVar1;
  int iVar2;
  __weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  undefined1 local_58 [8];
  shared_ptr<GraphNode> pointer;
  const_iterator local_40;
  weak_ptr<GraphNode> *local_38;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_30;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_28;
  iterator iter;
  int value_local;
  GraphNode *this_local;
  
  iter._M_current._4_4_ = value;
  local_28._M_current =
       (weak_ptr<GraphNode> *)
       std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::begin
                 (&this->m_pointers);
  while( true ) {
    local_30._M_current =
         (weak_ptr<GraphNode> *)
         std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::end
                   (&this->m_pointers);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
               ::operator->(&local_28)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>;
    bVar1 = std::__weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::expired(this_00);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
      ::__normal_iterator<std::weak_ptr<GraphNode>*>
                ((__normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
                  *)&local_40,&local_28);
      local_38 = (weak_ptr<GraphNode> *)
                 std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
                 erase(&this->m_pointers,local_40);
      local_28._M_current = local_38;
      pointer.super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
           ::operator--(&local_28,0);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
      ::operator->(&local_28);
      std::weak_ptr<GraphNode>::lock((weak_ptr<GraphNode> *)local_58);
      this_01 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_58);
      iVar2 = getValue(this_01);
      bVar1 = iVar2 == iter._M_current._4_4_;
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      std::shared_ptr<GraphNode>::~shared_ptr((shared_ptr<GraphNode> *)local_58);
      if (bVar1) goto LAB_001660c4;
    }
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
    ::operator++(&local_28,0);
  }
  this_local._7_1_ = 0;
LAB_001660c4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GraphNode::hasPointer(int value) {
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
        } else {
            auto pointer = iter->lock();
            if (pointer->getValue() == value)
                return true;
        }

    return false;
}